

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O3

void Abc_NtkCheckAbsorb(Abc_Ntk_t *pNtk,int nLutSize)

{
  int *piVar1;
  uint uVar2;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pPivot;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  void *__s;
  Vec_Ptr_t *vFanins;
  void **__ptr;
  long lVar6;
  int iVar7;
  long lVar8;
  Vec_Ptr_t *pVVar9;
  uint uVar10;
  timespec ts;
  timespec local_48;
  long local_38;
  
  iVar4 = clock_gettime(3,&local_48);
  if (iVar4 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  pVVar9 = pNtk->vObjs;
  uVar2 = pVVar9->nSize;
  uVar5 = 0x10;
  if (0xe < uVar2 - 1) {
    uVar5 = uVar2;
  }
  uVar10 = 0;
  if (uVar5 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar5 << 2);
  }
  memset(__s,0,(long)(int)uVar2 * 4);
  vFanins = (Vec_Ptr_t *)malloc(0x10);
  vFanins->nCap = 100;
  vFanins->nSize = 0;
  __ptr = (void **)malloc(800);
  vFanins->pArray = __ptr;
  if (0 < (int)uVar2) {
    lVar8 = 0;
    uVar10 = 0;
    local_38 = lVar6;
    do {
      pObj = (Abc_Obj_t *)pVVar9->pArray[lVar8];
      if (((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) &&
         (0 < (pObj->vFanins).nSize)) {
        lVar6 = 0;
        do {
          pPivot = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar6]];
          if (((*(uint *)&pPivot->field_0x14 & 0xf) == 7) &&
             (iVar4 = Abc_ObjCheckAbsorb(pObj,pPivot,nLutSize,vFanins), iVar4 != 0)) {
            if (uVar2 <= (uint)pPivot->Id) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
            }
            piVar1 = (int *)((long)__s + (ulong)(uint)pPivot->Id * 4);
            *piVar1 = *piVar1 + 1;
            uVar10 = uVar10 + 1;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < (pObj->vFanins).nSize);
        pVVar9 = pNtk->vObjs;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar9->nSize);
    __ptr = vFanins->pArray;
    lVar6 = local_38;
  }
  if (__ptr != (void **)0x0) {
    free(__ptr);
    pVVar9 = pNtk->vObjs;
  }
  free(vFanins);
  if ((long)pVVar9->nSize < 1) {
    iVar4 = 0;
  }
  else {
    lVar8 = 0;
    iVar4 = 0;
    do {
      pvVar3 = pVVar9->pArray[lVar8];
      if ((pvVar3 != (void *)0x0) && ((*(uint *)((long)pvVar3 + 0x14) & 0xf) == 7)) {
        iVar7 = *(int *)((long)pvVar3 + 0x10);
        if (((long)iVar7 < 0) || ((int)uVar2 <= iVar7)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar4 = iVar4 + (uint)(*(int *)((long)__s + (long)iVar7 * 4) ==
                              *(int *)((long)pvVar3 + 0x2c));
      }
      lVar8 = lVar8 + 1;
    } while (pVVar9->nSize != lVar8);
  }
  printf("Absorted = %6d. (%6.2f %%)   Fully = %6d. (%6.2f %%)  ",
         ((double)(int)uVar10 * 100.0) / (double)pNtk->nObjCounts[7],
         ((double)iVar4 * 100.0) / (double)pNtk->nObjCounts[7],(ulong)uVar10);
  iVar7 = 3;
  iVar4 = clock_gettime(3,&local_48);
  if (iVar4 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  Abc_Print(iVar7,"%s =","Time");
  Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar8 + lVar6) / 1000000.0);
  return;
}

Assistant:

void Abc_NtkCheckAbsorb( Abc_Ntk_t * pNtk, int nLutSize )
{
    Vec_Int_t * vCounts;
    Vec_Ptr_t * vFanins;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, Counter = 0, Counter2 = 0;
    abctime clk = Abc_Clock();
    vCounts = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    vFanins = Vec_PtrAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pObj, i )
    Abc_ObjForEachFanin( pObj, pFanin, k )
        if ( Abc_ObjIsNode(pFanin) && Abc_ObjCheckAbsorb( pObj, pFanin, nLutSize, vFanins ) )
        {
            Vec_IntAddToEntry( vCounts, Abc_ObjId(pFanin), 1 );
            Counter++;
        }
    Vec_PtrFree( vFanins );
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( Vec_IntEntry(vCounts, Abc_ObjId(pObj)) == Abc_ObjFanoutNum(pObj) )
        {
//            printf( "%d ", Abc_ObjId(pObj) );
            Counter2++;
        }
    printf( "Absorted = %6d. (%6.2f %%)   Fully = %6d. (%6.2f %%)  ", 
        Counter,  100.0 * Counter  / Abc_NtkNodeNum(pNtk), 
        Counter2, 100.0 * Counter2 / Abc_NtkNodeNum(pNtk) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}